

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnObj.c
# Opt level: O0

int Wln_ObjClone(Wln_Ntk_t *pNew,Wln_Ntk_t *p,int iObj)

{
  int iVar1;
  int Signed;
  int End;
  int Beg;
  int iObj_local;
  Wln_Ntk_t *p_local;
  Wln_Ntk_t *pNew_local;
  
  iVar1 = Wln_ObjType(p,iObj);
  Signed = Wln_ObjIsSigned(p,iObj);
  End = Wln_ObjRangeEnd(p,iObj);
  Beg = Wln_ObjRangeBeg(p,iObj);
  iVar1 = Wln_ObjAlloc(pNew,iVar1,Signed,End,Beg);
  return iVar1;
}

Assistant:

int Wln_ObjClone( Wln_Ntk_t * pNew, Wln_Ntk_t * p, int iObj )
{
    return Wln_ObjAlloc( pNew, Wln_ObjType(p, iObj), Wln_ObjIsSigned(p, iObj), Wln_ObjRangeEnd(p, iObj), Wln_ObjRangeBeg(p, iObj) );
}